

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::
     global_exscan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
               (long begin,long end,int *out,comm *param_4)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int local_4c;
  comm nonzero_comm;
  
  comm::split(&nonzero_comm,param_4,(uint)(end - begin != 0));
  if (end != begin) {
    uVar3 = end - begin >> 2;
    iVar1 = *(int *)(begin + -4 + uVar3 * 4);
    local_exscan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
              (begin,end,out);
    local_4c = iVar1 + out[uVar3 - 1];
    iVar1 = exscan<int,std::plus<int>>(&local_4c,&nonzero_comm,1);
    *out = iVar1;
    for (uVar2 = 1; uVar2 < uVar3; uVar2 = uVar2 + 1) {
      out[uVar2] = out[uVar2] + iVar1;
    }
  }
  comm::~comm(&nonzero_comm);
  return;
}

Assistant:

void global_exscan(InIterator begin, InIterator end, OutIterator out, Func func, const mxx::comm& comm = mxx::comm()) {
    OutIterator o = out;
    size_t n = std::distance(begin, end);
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        typedef typename std::iterator_traits<OutIterator>::value_type T;
        T sum = *(begin+(n-1));
        // local scan
        local_exscan(begin, end, out, func);
        // mxx::scan
        sum += *(o + (n-1));
        T presum = exscan(sum, func, nonzero_comm);
        *o++ = presum;
        // accumulate previous sum on all local elements
        for (size_t i = 1; i < n; ++i) {
            *o = func(presum, *o);
            ++o;
        }
    }
}